

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

size_t __thiscall
nodecpp::log::SkippedMsgCounters::toStr(SkippedMsgCounters *this,char *buff,size_t sz)

{
  bool bVar1;
  anon_class_8_1_8991fb9c local_60;
  undefined1 local_58 [8];
  format_to_n_result<char_*> r;
  size_t i;
  SkippedMsgCounters *pSStack_38;
  bool added;
  size_t pos;
  SkippedMsgCounters *local_28;
  size_t sz_local;
  char *buff_local;
  SkippedMsgCounters *this_local;
  
  pos = (size_t)&local_28;
  local_28 = (SkippedMsgCounters *)sz;
  sz_local = (size_t)buff;
  buff_local = (char *)this;
  assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,nodecpp::log::SkippedMsgCounters::toStr(char*,unsigned_long)::__0>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/src/log.cpp"
             ,0xdb,(anon_class_8_1_3fcf6725 *)&pos,"sz >= reportMaxSize");
  *(undefined8 *)sz_local = 0x64657070696b733c;
  *(undefined1 *)(sz_local + 8) = 0x3a;
  pSStack_38 = (SkippedMsgCounters *)0x9;
  bVar1 = false;
  for (r.size = 0; r.size < 5; r.size = r.size + 1) {
    if ((this->skippedCtrs[r.size] != 0) && (pSStack_38 < local_28)) {
      _local_58 = fmt::v7::format_to_n<char_*,_char[8],_const_char_*,_unsigned_int,_0>
                            ((char *)((long)pSStack_38->skippedCtrs + sz_local),
                             (long)local_28 - (long)pSStack_38,(char (*) [8])"{}:{}, ",
                             (char **)(LogLevelNames + r.size * 8),this->skippedCtrs + r.size);
      pSStack_38 = (SkippedMsgCounters *)(r.out + (long)pSStack_38);
      bVar1 = true;
    }
  }
  if (bVar1) {
    *(char *)((long)pSStack_38->skippedCtrs + (sz_local - 2)) = '>';
    *(char *)((long)pSStack_38->skippedCtrs + (sz_local - 1)) = '\n';
    this_local = pSStack_38;
  }
  else {
    local_60.this = this;
    assert::
    nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,nodecpp::log::SkippedMsgCounters::toStr(char*,unsigned_long)::__1,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/src/log.cpp"
               ,0xee,&local_60,"fullCnt_ == 0","indeed: {}",&this->fullCnt_);
    this_local = (SkippedMsgCounters *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t SkippedMsgCounters::toStr( char* buff, size_t sz) {
		NODECPP_ASSERT( foundation::module_id, ::nodecpp::assert::AssertLevel::critical, sz >= reportMaxSize ); 
		memcpy( buff, "<skipped: ", 9 );
		size_t pos = 9;
		bool added = false;
		for ( size_t i=0; i<log_level_count; ++i )
			if ( skippedCtrs[i] && pos < sz )					
			{
				auto r = ::fmt::format_to_n( buff + pos, sz - pos, "{}:{}, ", LogLevelNames[i], skippedCtrs[i] );
				pos += r.size;
				added = true;
			}
		if ( added )
		{
			buff[pos - 2] = '>';
			buff[pos - 1] = '\n';
			return pos;
		}
		else
		{
			NODECPP_ASSERT( foundation::module_id, ::nodecpp::assert::AssertLevel::critical, fullCnt_ == 0, "indeed: {}", fullCnt_ ); 
			return 0;
		}
	}